

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O0

void __thiscall
FIX::HttpConnection::showRow
          (HttpConnection *this,stringstream *s,string *name,string *value,string *url)

{
  undefined1 local_8d8 [8];
  CENTER center;
  TD td_2;
  TD td_1;
  TD td;
  undefined1 local_1e8 [8];
  TR tr;
  string *url_local;
  string *value_local;
  string *name_local;
  stringstream *s_local;
  HttpConnection *this_local;
  
  tr.super_TAG.m_stream = (ostream *)url;
  HTML::TR::TR((TR *)local_1e8,(ostream *)(s + 0x10));
  HTML::TAG::text((TAG *)local_1e8);
  HTML::TD::TD((TD *)&td_1.super_TAG.m_stream,(ostream *)(s + 0x10));
  HTML::TAG::text<std::__cxx11::string>((TAG *)&td_1.super_TAG.m_stream,name);
  HTML::TD::~TD((TD *)&td_1.super_TAG.m_stream);
  HTML::TD::TD((TD *)&td_2.super_TAG.m_stream,(ostream *)(s + 0x10));
  HTML::TAG::text<std::__cxx11::string>((TAG *)&td_2.super_TAG.m_stream,value);
  HTML::TD::~TD((TD *)&td_2.super_TAG.m_stream);
  HTML::TD::TD((TD *)&center.super_TAG.m_stream,(ostream *)(s + 0x10));
  HTML::TAG::text((TAG *)&center.super_TAG.m_stream);
  HTML::CENTER::CENTER((CENTER *)local_8d8,(ostream *)(s + 0x10));
  HTML::TAG::text((TAG *)local_8d8);
  HTML::CENTER::~CENTER((CENTER *)local_8d8);
  HTML::TD::~TD((TD *)&center.super_TAG.m_stream);
  HTML::TR::~TR((TR *)local_1e8);
  return;
}

Assistant:

void HttpConnection::showRow(
    std::stringstream &s,
    const std::string &name,
    const std::string &value,
    const std::string &url) {
  {
    TR tr(s);
    tr.text();
    {
      TD td(s);
      td.text(name);
    }
    {
      TD td(s);
      td.text(value);
    }
    {
      TD td(s);
      td.text();
      CENTER center(s);
      center.text();
    }
  }
}